

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O0

void __thiscall InstructionGenerator::genCloneTop(InstructionGenerator *this,string *varName)

{
  Compiler *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Variable *pVVar4;
  uint local_16c;
  uint a;
  Variable *var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [8];
  string arrayIndex;
  string local_98 [8];
  string arrayName;
  char local_70 [48];
  string local_40 [36];
  uint local_1c;
  string *psStack_18;
  int varPos;
  string *varName_local;
  InstructionGenerator *this_local;
  
  psStack_18 = varName;
  varName_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)varName);
  uVar2 = VirtualStack::isVariable(&this->super_VirtualStack,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  local_1c = uVar2;
  if (-1 < (int)uVar2) {
    bVar1 = Parser::isArrayDefinition(&this->parser,psStack_18);
    if (bVar1) {
      std::__cxx11::string::string(local_98);
      std::__cxx11::string::string(local_b8);
      std::__cxx11::string::string(local_d8,(string *)psStack_18);
      Parser::splitArrayDefinition
                (&this->parser,(string *)local_d8,(string *)local_98,(string *)local_b8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"",&local_f9);
      std::__cxx11::string::string(local_120,local_98);
      iVar3 = VirtualStack::isVariable(&this->super_VirtualStack,(string *)local_120);
      genCreateInt(this,(string *)local_f8,iVar3 + 1);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      this_00 = this->compiler;
      std::operator+((char *)&var,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(");
      std::operator+(local_140,(char *)&var);
      Compiler::evaluateBracket(this_00,local_140);
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)&var);
      genMathSubtract(this,2);
      genDynamicCloneTop(this);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_98);
    }
    else {
      pVVar4 = VirtualStack::getVariable(&this->super_VirtualStack,local_1c);
      if ((pVVar4->isArray & 1U) == 0) {
        genCloneTop(this,local_1c);
      }
      else {
        for (local_16c = 0; local_16c < pVVar4->arrayLength; local_16c = local_16c + 1) {
          genCloneTop(this,local_1c);
        }
      }
    }
    return;
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x20);
  std::operator+(local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "Undefined variable \'");
  std::operator+(__lhs,local_70);
  __cxa_throw(__lhs,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void InstructionGenerator::genCloneTop(const std::string &varName)
{
    int varPos = isVariable(varName);
    if(varPos < 0)
        throw std::string("Undefined variable '" + varName + "'");
    else
    {
        if(parser.isArrayDefinition(varName)) //Check if the variable is an array to calculate element offset
        {
            //Split array definition into name and size
            std::string arrayName;
            std::string arrayIndex;
            parser.splitArrayDefinition(varName, arrayName, arrayIndex);

            //Push array base position to stack
            genCreateInt("", static_cast<unsigned int>(isVariable(arrayName)+1));

            //Push index value to stack
            compiler->evaluateBracket("(" + arrayIndex + ")");

            //Subtract them to calculate offset
            genMathSubtract(2);

            //Dynamic clone top the calculated offset to the top
            genDynamicCloneTop();
        }
        else //Else if not an array element
        {
            //Check if we're moving a whole array
            Variable &var = getVariable(varPos);
            if(var.isArray) //We're moving a whole array
            {
                for(unsigned int a = 0; a < var.arrayLength; a++)
                {
                    genCloneTop(varPos); //We can keep using varPos repeatedly as the offset of the next variable is changed by pushing more things to the stack
                }
            }
            else //We're moving a single variable
            {
                genCloneTop(varPos);
            }
        }
    }
}